

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomFreakOperator.cpp
# Opt level: O0

void __thiscall
lts2::RandomFreakOperator::initWithPatchSize(RandomFreakOperator *this,Size *patchSize)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  IntegratingCell *pIVar4;
  void *pvVar5;
  float fVar6;
  int local_bc;
  uint local_ac;
  uint randomPair;
  int i_1;
  RNG rng;
  uint local_98;
  uint i;
  uint k;
  uint j;
  BasisFunction *allPairs;
  float omega;
  float phi;
  uint ring_1;
  IntegratingCell *p_cells;
  float local_68;
  int ring;
  float filterSigma [8];
  float ringRadius [8];
  float unitSpace;
  int patchRadius;
  Size *local_18;
  Size *patchSize_local;
  RandomFreakOperator *this_local;
  
  local_18 = patchSize;
  patchSize_local = (Size *)this;
  cv::Size_<int>::Size_((Size_<int> *)&unitSpace,patchSize);
  LBDOperator::setPatchSize(&this->super_LBDOperator,(Size *)&unitSpace);
  if ((this->super_LBDOperator)._patchSize.height < (this->super_LBDOperator)._patchSize.width) {
    local_bc = (this->super_LBDOperator)._patchSize.height;
  }
  else {
    local_bc = (this->super_LBDOperator)._patchSize.width;
  }
  fVar6 = ((float)local_bc * 22.0) / 1575.0;
  filterSigma[6] = (float)(local_bc / 0x19);
  filterSigma[7] = fVar6 + filterSigma[6];
  local_68 = filterSigma[6] / 2.0;
  ring = (int)(filterSigma[7] / 2.0);
  filterSigma[0] = (fVar6 * 3.0 + filterSigma[6]) / 2.0;
  filterSigma[1] = (fVar6 * 6.0 + filterSigma[6]) / 2.0;
  filterSigma[2] = (fVar6 * 10.0 + filterSigma[6]) / 2.0;
  filterSigma[3] = (fVar6 * 15.0 + filterSigma[6]) / 2.0;
  filterSigma[4] = (fVar6 * 21.0 + filterSigma[6]) / 2.0;
  filterSigma[5] = filterSigma[6] / 3.0;
  (this->super_LBDOperator)._patternPoints = 0;
  for (p_cells._4_4_ = 0; p_cells._4_4_ < 8; p_cells._4_4_ = p_cells._4_4_ + 1) {
    (this->super_LBDOperator)._patternPoints =
         FREAKS_CELLS_PER_RING[p_cells._4_4_] + (this->super_LBDOperator)._patternPoints;
  }
  if (((this->super_LBDOperator)._sensitiveCells != (IntegratingCell *)0x0) &&
     (pIVar4 = (this->super_LBDOperator)._sensitiveCells, pIVar4 != (IntegratingCell *)0x0)) {
    operator_delete__(pIVar4);
  }
  auVar1 = ZEXT416((this->super_LBDOperator)._patternPoints) * ZEXT816(0x18);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pIVar4 = (IntegratingCell *)operator_new__(uVar3);
  (this->super_LBDOperator)._sensitiveCells = pIVar4;
  _phi = (this->super_LBDOperator)._sensitiveCells;
  for (omega = 0.0; (uint)omega < 8; omega = (float)((int)omega + 1)) {
    LBDOperator::updateRingCells
              (&this->super_LBDOperator,_phi,FREAKS_CELLS_PER_RING[(uint)omega],
               (&local_68)[(uint)omega],filterSigma[(ulong)(uint)omega + 6],
               (float)(6.283185307179586 / (double)FREAKS_CELLS_PER_RING[(uint)omega]),
               (float)((3.141592653589793 / (double)FREAKS_CELLS_PER_RING[(uint)omega]) *
                      (double)(uint)omega));
    _phi = _phi + FREAKS_CELLS_PER_RING[(uint)omega];
  }
  auVar1 = ZEXT416((this->super_LBDOperator)._patternPoints *
                   ((this->super_LBDOperator)._patternPoints - 1) >> 1) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar3);
  local_98 = 0;
  for (i = 1; i < (this->super_LBDOperator)._patternPoints; i = i + 1) {
    for (rng.state._4_4_ = 0; rng.state._4_4_ < i; rng.state._4_4_ = rng.state._4_4_ + 1) {
      *(uint *)((long)pvVar5 + (ulong)local_98 * 8) = rng.state._4_4_;
      *(uint *)((long)pvVar5 + (ulong)local_98 * 8 + 4) = i;
      local_98 = local_98 + 1;
    }
  }
  cv::RNG::RNG((RNG *)&randomPair,0x2a);
  for (local_ac = 0; local_ac < *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc;
      local_ac = local_ac + 1) {
    uVar2 = cv::RNG::operator()((RNG *)&randomPair,0x281);
    (this->super_LBDOperator)._basisFunctions[(int)local_ac] =
         *(BasisFunction *)((long)pvVar5 + (ulong)uVar2 * 8);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return;
}

Assistant:

void lts2::RandomFreakOperator::initWithPatchSize(cv::Size patchSize)
{
    // Set the size variable
    this->setPatchSize(patchSize);
    
    int patchRadius = MIN(_patchSize.width, _patchSize.height);
    
    // Update the filter sizes
    // unit = (smallest_radius - biggest_radius) / 21
    float unitSpace = 22.0f * patchRadius / 1575.f;
    
    float ringRadius[8];
    ringRadius[0] = patchRadius / 25;
    ringRadius[1] = ringRadius[0] + 1  * unitSpace; //
    ringRadius[2] = ringRadius[0] + 3  * unitSpace; //
    ringRadius[3] = ringRadius[0] + 6  * unitSpace; //
    ringRadius[4] = ringRadius[0] + 10 * unitSpace; // 
    ringRadius[5] = ringRadius[0] + 15 * unitSpace; // 
    ringRadius[6] = ringRadius[0] + 21 * unitSpace; //
    ringRadius[7] = 0;                              // Center point
    
    float filterSigma[8];
    filterSigma[0] = ringRadius[0] / 2;
    filterSigma[1] = ringRadius[1] / 2;
    filterSigma[2] = ringRadius[2] / 2;
    filterSigma[3] = ringRadius[3] / 2;
    filterSigma[4] = ringRadius[4] / 2;
    filterSigma[5] = ringRadius[5] / 2;
    filterSigma[6] = ringRadius[6] / 2;
    filterSigma[7] = ringRadius[0] / 3; // Center point
    
    // Create the measurement points
    _patternPoints = 0;
    for (int ring = 0; ring < 8; ++ring)
        _patternPoints += FREAKS_CELLS_PER_RING[ring];
    
    // Reset
    if (_sensitiveCells)
        delete[] _sensitiveCells;
    _sensitiveCells = new lbd::IntegratingCell[_patternPoints];
    
    lbd::IntegratingCell* p_cells = _sensitiveCells;
    for (unsigned int ring = 0; ring < 8; ++ring)
    {
        float phi = M_PI / FREAKS_CELLS_PER_RING[ring] * ring;
        float omega = 2.0 * M_PI / FREAKS_CELLS_PER_RING[ring];
        
        updateRingCells(p_cells, FREAKS_CELLS_PER_RING[ring], filterSigma[ring], 
                        ringRadius[ring], omega, phi);
        
        p_cells += FREAKS_CELLS_PER_RING[ring];
    }
    
    // Create the possible pairs
    lbd::BasisFunction* allPairs = new lbd::BasisFunction[_patternPoints*(_patternPoints-1)/2];
    for (unsigned int j = 1, k = 0; j < _patternPoints; ++j)
        for (unsigned i = 0; i < j; ++i, ++k)
        {
            allPairs[k].pos_cell = i;
            allPairs[k].neg_cell = j;
        }
    
    // Now, select randomly lbd::kLbdPairsInUse pairs
    cv::RNG rng(42);
    for (int i = 0; i < _pairsInUse; ++i)
    {
      unsigned int randomPair = rng(lbd::kFreakTotalPairs);
      _basisFunctions[i] = allPairs[randomPair];
    }
    
    // Not needed anymore
    delete[] allPairs;
}